

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SegReaderDoclistCmpRev(Fts3SegReader *pLhs,Fts3SegReader *pRhs)

{
  int iVar1;
  
  iVar1 = (uint)(pLhs->pOffsetList == (char *)0x0) - (uint)(pRhs->pOffsetList == (char *)0x0);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (pLhs->iDocid == pRhs->iDocid) {
    return pRhs->iIdx - pLhs->iIdx;
  }
  return (uint)(pLhs->iDocid < pRhs->iDocid) * 2 + -1;
}

Assistant:

static int fts3SegReaderDoclistCmpRev(Fts3SegReader *pLhs, Fts3SegReader *pRhs){
  int rc = (pLhs->pOffsetList==0)-(pRhs->pOffsetList==0);
  if( rc==0 ){
    if( pLhs->iDocid==pRhs->iDocid ){
      rc = pRhs->iIdx - pLhs->iIdx;
    }else{
      rc = (pLhs->iDocid < pRhs->iDocid) ? 1 : -1;
    }
  }
  assert( pLhs->aNode && pRhs->aNode );
  return rc;
}